

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_sl_CmdLineParser.h
# Opt level: O1

bool __thiscall
axl::sl::CmdLineParser<(anonymous_namespace)::MyParser,_(anonymous_namespace)::MySwitchTable>::
processSwitch(CmdLineParser<(anonymous_namespace)::MyParser,_(anonymous_namespace)::MySwitchTable>
              *this,SwitchInfo *switchInfo,StringRef *switchName,StringRef *value)

{
  int iVar1;
  C *pCVar2;
  
  iVar1 = (this->super_CmdLineParserRoot).m_valueSwitchKind;
  if (iVar1 == 0) {
    if ((switchInfo->m_value == (char *)0x0) || (value->m_length != 0)) {
      anon_unknown.dwarf_2a0df::MyParser::onSwitch
                ((MyParser *)(ulong)(uint)switchInfo->m_switchKind,(SwitchKind)value,switchName);
    }
    else {
      (this->super_CmdLineParserRoot).m_valueSwitchKind = switchInfo->m_switchKind;
      StringBase<char,_axl::sl::StringDetailsBase<char>_>::copy
                (&(this->super_CmdLineParserRoot).m_valueSwitchName,(EVP_PKEY_CTX *)switchName,
                 (EVP_PKEY_CTX *)switchName);
    }
  }
  else {
    if ((this->super_CmdLineParserRoot).m_valueSwitchName.
        super_StringRefBase<char,_axl::sl::StringDetailsBase<char>_>.m_length == 0) {
      pCVar2 = &StringDetailsImpl<char>::getEmptyString()::emptyString;
    }
    else {
      pCVar2 = (this->super_CmdLineParserRoot).m_valueSwitchName.
               super_StringRefBase<char,_axl::sl::StringDetailsBase<char>_>.m_p;
    }
    err::setFormatStringError("missing value for switch \'%s\'",pCVar2);
  }
  return iVar1 == 0;
}

Assistant:

bool
	checkMissingValue() {
		if (!m_valueSwitchKind)
			return true;

		err::setFormatStringError("missing value for switch '%s'", m_valueSwitchName.sz());
		return false;
	}